

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  DescriptorPool *this_00;
  pointer pMVar5;
  pointer pMVar6;
  bool bVar7;
  ExtensionRange *pEVar8;
  FieldDescriptor *pFVar9;
  string *psVar10;
  string *extraout_RAX;
  ulong uVar11;
  Reflection *this_01;
  uint res;
  byte *pbVar12;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *this_02;
  uint number;
  long lVar13;
  char cVar14;
  pair<const_char_*,_unsigned_int> pVar15;
  MapIterator MStack_128;
  MapIterator MStack_d0;
  ParseContext *pPStack_78;
  long lStack_70;
  long lStack_68;
  MessageSetParser *pMStack_60;
  undefined1 *puStack_58;
  code *pcStack_50;
  byte *local_48 [3];
  
  local_48[0] = (byte *)ptr;
  do {
    pcStack_50 = (code *)0x337fb8;
    bVar7 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)local_48,ctx->group_depth_);
    if (bVar7) {
      return (char *)local_48[0];
    }
    bVar2 = *local_48[0];
    res = (uint)bVar2;
    pbVar12 = local_48[0] + 1;
    if ((char)bVar2 < '\0') {
      res = ((uint)bVar2 + (uint)*pbVar12 * 0x80) - 0x80;
      if ((char)*pbVar12 < '\0') {
        pcStack_50 = (code *)0x337ff1;
        pVar15 = ReadTagFallback((char *)local_48[0],res);
        pbVar12 = (byte *)pVar15.first;
        res = pVar15.second;
      }
      else {
        pbVar12 = local_48[0] + 2;
      }
    }
    local_48[0] = pbVar12;
    if (pbVar12 == (byte *)0x0) {
      cVar14 = '\x01';
    }
    else {
      bVar7 = (res & 7) != 4;
      pFVar9 = (FieldDescriptor *)(ulong)bVar7;
      if (res != 0 && bVar7) {
        if (res == 0xb) {
          iVar3 = ctx->depth_;
          lVar1 = (long)iVar3 + -1;
          ctx->depth_ = (int)lVar1;
          if ((long)iVar3 < 1) {
            pbVar12 = (byte *)0x0;
          }
          else {
            lVar13 = (long)ctx->group_depth_ + 1;
            ctx->group_depth_ = (int)lVar13;
            pcStack_50 = (code *)0x338056;
            pbVar12 = (byte *)ParseElement(this,(char *)pbVar12,ctx);
            if (pbVar12 != (byte *)0x0) {
              if ((int)lVar1 == ctx->depth_) {
                psVar10 = (string *)0x0;
              }
              else {
                pcStack_50 = (code *)0x338135;
                psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                    (lVar1,(long)ctx->depth_,"old_depth == depth_");
              }
              if (psVar10 != (string *)0x0) {
                pcStack_50 = (code *)0x338177;
                ParseMessageSet();
                psVar10 = extraout_RAX;
LAB_00338177:
                this_02 = (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                           *)(local_48 + 1);
                pcStack_50 = MapKeySorter::SortKey;
                ParseMessageSet();
                pPStack_78 = ctx;
                lStack_70 = lVar13;
                lStack_68 = lVar1;
                pMStack_60 = this;
                puStack_58 = (undefined1 *)local_48;
                pcStack_50 = (code *)pbVar12;
                (this_02->
                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (this_02->
                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (this_02->
                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                Reflection::MapBegin(&MStack_128,this_01,(Message *)psVar10,pFVar9);
                while( true ) {
                  Reflection::MapEnd(&MStack_d0,this_01,(Message *)psVar10,pFVar9);
                  bVar7 = MapFieldBase::EqualIterator(MStack_128.map_,&MStack_128,&MStack_d0);
                  if ((MStack_d0.key_.type_ == CPPTYPE_STRING) &&
                     (MStack_d0.key_.val_._0_8_ != (undefined1 *)((long)&MStack_d0.key_.val_ + 0x10)
                     )) {
                    operator_delete((void *)MStack_d0.key_.val_.int64_value,
                                    MStack_d0.key_.val_._16_8_ + 1);
                  }
                  if (bVar7) break;
                  std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::
                  push_back(this_02,&MStack_128.key_);
                  MapFieldBase::IncreaseIterator(MStack_128.map_,&MStack_128);
                }
                if ((MStack_128.key_.type_ == CPPTYPE_STRING) &&
                   (MStack_128.key_.val_._0_8_ != (undefined1 *)((long)&MStack_128.key_.val_ + 0x10)
                   )) {
                  operator_delete((void *)MStack_128.key_.val_.int64_value,
                                  MStack_128.key_.val_._16_8_ + 1);
                }
                pMVar5 = (this_02->
                         super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pMVar6 = (this_02->
                         super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                if (pMVar5 != pMVar6) {
                  uVar11 = ((long)pMVar6 - (long)pMVar5 >> 3) * -0x3333333333333333;
                  lVar1 = 0x3f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
                            (pMVar5,pMVar6,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
                            (pMVar5,pMVar6);
                }
                return (char *)this_02;
              }
              if ((int)lVar13 == ctx->group_depth_) {
                psVar10 = (string *)0x0;
              }
              else {
                pcStack_50 = (code *)0x338149;
                psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                    (lVar13,(long)ctx->group_depth_,
                                     "old_group_depth == group_depth_");
              }
              if (psVar10 != (string *)0x0) goto LAB_00338177;
            }
            ctx->group_depth_ = ctx->group_depth_ + -1;
            ctx->depth_ = ctx->depth_ + 1;
            uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
            if (uVar4 != 0xb) {
              pbVar12 = (byte *)0x0;
            }
          }
        }
        else {
          number = res >> 3;
          pcStack_50 = (code *)0x3380bd;
          pEVar8 = Descriptor::FindExtensionRangeContainingNumber(this->descriptor,number);
          if (pEVar8 == (ExtensionRange *)0x0) {
            pFVar9 = (FieldDescriptor *)0x0;
          }
          else {
            this_00 = (ctx->data_).pool;
            if (this_00 == (DescriptorPool *)0x0) {
              pcStack_50 = (code *)0x3380ee;
              pFVar9 = Reflection::FindKnownExtensionByNumber(this->reflection,number);
            }
            else {
              pcStack_50 = (code *)0x3380d7;
              pFVar9 = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor,number);
            }
          }
          pcStack_50 = (code *)0x338106;
          pbVar12 = (byte *)_InternalParseAndMergeField
                                      (this->msg,(char *)local_48[0],ctx,(ulong)res,this->reflection
                                       ,pFVar9);
        }
        cVar14 = pbVar12 == (byte *)0x0;
        local_48[0] = pbVar12;
      }
      else {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar14 = '\x03';
      }
    }
    if (cVar14 != '\0') {
      if (cVar14 == '\x01') {
        local_48[0] = (byte *)0x0;
      }
      return (char *)local_48[0];
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }